

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

bool __thiscall
LocationToFailAllocNode::shouldFail
          (LocationToFailAllocNode *this,int allocationNumber,char *file,size_t line)

{
  int iVar1;
  size_t line_local;
  char *file_local;
  int allocationNumber_local;
  LocationToFailAllocNode *this_local;
  
  if (((this->file_ != (char *)0x0) && (iVar1 = SimpleString::StrCmp(file,this->file_), iVar1 == 0))
     && (line == this->line_)) {
    this->actualAllocNumber_ = this->actualAllocNumber_ + 1;
    return this->actualAllocNumber_ == this->allocNumberToFail_;
  }
  return allocationNumber == this->allocNumberToFail_;
}

Assistant:

bool shouldFail(int allocationNumber, const char* file, size_t line)
    {
      if (file_ && SimpleString::StrCmp(file, file_) == 0 && line == line_) {
        actualAllocNumber_++;
        return actualAllocNumber_ == allocNumberToFail_;
      }
      if (allocationNumber == allocNumberToFail_)
        return true;
      return false;
    }